

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Real Omega_h::get_metric_scalar_for_nelems(Int elem_dim,Real expected_nelems,Real target_nelems)

{
  Real metric_scal;
  Real size_scal;
  Real target_nelems_local;
  Real expected_nelems_local;
  Int elem_dim_local;
  double local_1c0;
  
  local_1c0 = target_nelems / expected_nelems;
  if (elem_dim == 1) {
    local_1c0 = local_1c0 * local_1c0;
  }
  else if (elem_dim != 2) {
    if (elem_dim == 3) {
      local_1c0 = cbrt(local_1c0 * local_1c0);
    }
    else {
      local_1c0 = -1.0;
    }
  }
  return local_1c0;
}

Assistant:

Real get_metric_scalar_for_nelems(
    Int elem_dim, Real expected_nelems, Real target_nelems) {
  auto size_scal = target_nelems / expected_nelems;
  auto metric_scal = power(size_scal, 2, elem_dim);
  return metric_scal;
}